

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,1,1>::accumulateDerivativesImpl<true,true,false>
          (BeagleCPUImpl<double,1,1> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar2 = *(uint *)(this + 0x14);
  lVar3 = *(long *)(this + 0x100);
  lVar4 = *(long *)(this + 0xf8);
  lVar5 = *(long *)(this + 0x80);
  auVar7 = ZEXT816(0) << 0x40;
  for (uVar6 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar6; uVar6 = uVar6 + 1) {
    auVar8._0_8_ = *(double *)(lVar3 + uVar6 * 8) / *(double *)(lVar4 + uVar6 * 8);
    auVar8._8_8_ = 0;
    outDerivatives[uVar6] = auVar8._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(lVar5 + uVar6 * 8);
    auVar7 = vfmadd231sd_fma(auVar7,auVar8,auVar1);
  }
  *outSumDerivatives = auVar7._0_8_;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}